

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O0

_Bool node_verify(wb_tree *tree,wb_node *parent,wb_node *node,uint *weight)

{
  _Bool _Var1;
  int iVar2;
  bool bVar3;
  uint local_44;
  uint local_40;
  uint local_38;
  uint local_34;
  uint rweight;
  uint lweight;
  uint *weight_local;
  wb_node *node_local;
  wb_node *parent_local;
  wb_tree *tree_local;
  
  _rweight = weight;
  weight_local = (uint *)node;
  node_local = parent;
  parent_local = (wb_node *)tree;
  if (parent == (wb_node *)0x0) {
    if (tree->root != node) {
      fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
              ,0x17d,"node_verify","tree->root == node");
      return false;
    }
  }
  else {
    bVar3 = true;
    if (parent->llink != node) {
      bVar3 = parent->rlink == node;
    }
    if (!bVar3) {
      fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
              ,0x17f,"node_verify","parent->llink == node || parent->rlink == node");
      return false;
    }
  }
  if (node == (wb_node *)0x0) {
    *weight = 1;
  }
  else {
    if (node->parent != parent) {
      fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
              ,0x182,"node_verify","node->parent == parent");
      return false;
    }
    if (parent != (wb_node *)0x0) {
      if (parent->llink == node) {
        iVar2 = (*tree->cmp_func)(parent->key,node->key);
        if (iVar2 < 1) {
          fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
                  ,0x185,"node_verify","tree->cmp_func(parent->key, node->key) > 0");
          return false;
        }
      }
      else {
        if (parent->rlink != node) {
          fprintf(_stderr,"\n%s:%d (%s) assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
                  ,0x187,"node_verify","parent->rlink == node");
          abort();
        }
        iVar2 = (*tree->cmp_func)(parent->key,node->key);
        if (-1 < iVar2) {
          fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
                  ,0x188,"node_verify","tree->cmp_func(parent->key, node->key) < 0");
          return false;
        }
      }
    }
    _Var1 = node_verify((wb_tree *)parent_local,(wb_node *)weight_local,
                        *(wb_node **)(weight_local + 6),&local_34);
    if ((!_Var1) ||
       (_Var1 = node_verify((wb_tree *)parent_local,(wb_node *)weight_local,
                            *(wb_node **)(weight_local + 8),&local_38), !_Var1)) {
      return false;
    }
    if (*(long *)(weight_local + 6) == 0) {
      local_40 = 1;
    }
    else {
      local_40 = *(uint *)(*(long *)(weight_local + 6) + 0x28);
    }
    if (local_40 != local_34) {
      fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
              ,399,"node_verify","WEIGHT(node->llink) == lweight");
      return false;
    }
    if (*(long *)(weight_local + 8) == 0) {
      local_44 = 1;
    }
    else {
      local_44 = *(uint *)(*(long *)(weight_local + 8) + 0x28);
    }
    if (local_44 != local_38) {
      fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
              ,400,"node_verify","WEIGHT(node->rlink) == rweight");
      return false;
    }
    if (weight_local[10] != local_34 + local_38) {
      fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
              ,0x191,"node_verify","node->weight == lweight + rweight");
      return false;
    }
    if (local_34 * 1000 < weight_local[10] * 0x124) {
      fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
              ,0x192,"node_verify","lweight * 1000U >= node->weight * 292U");
      return false;
    }
    if (weight_local[10] * 0x2c4 < local_34 * 1000) {
      fprintf(_stderr,"\n%s:%d (%s) verification failed: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
              ,0x193,"node_verify","lweight * 1000U <= node->weight * 708U");
      return false;
    }
    *_rweight = local_34 + local_38;
  }
  return true;
}

Assistant:

static bool
node_verify(const wb_tree* tree, const wb_node* parent, const wb_node* node,
	    unsigned *weight)
{
    if (!parent) {
	VERIFY(tree->root == node);
    } else {
	VERIFY(parent->llink == node || parent->rlink == node);
    }
    if (node) {
	VERIFY(node->parent == parent);
	if (parent) {
	    if (parent->llink == node) {
		VERIFY(tree->cmp_func(parent->key, node->key) > 0);
	    } else {
		ASSERT(parent->rlink == node);
		VERIFY(tree->cmp_func(parent->key, node->key) < 0);
	    }
	}
	unsigned lweight, rweight;
	if (!node_verify(tree, node, node->llink, &lweight) ||
	    !node_verify(tree, node, node->rlink, &rweight))
	    return false;
	VERIFY(WEIGHT(node->llink) == lweight);
	VERIFY(WEIGHT(node->rlink) == rweight);
	VERIFY(node->weight == lweight + rweight);
	VERIFY(lweight * 1000U >= node->weight * 292U);
	VERIFY(lweight * 1000U <= node->weight * 708U);
	*weight = lweight + rweight;
    } else {
	*weight = 1;
    }
    return true;
}